

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetInt64
          (OptionInterpreter *this,int number,int64 value,Type type,UnknownFieldSet *unknown_fields)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (type == MAX_TYPE) {
    value = value >> 0x3f ^ value * 2;
  }
  else {
    if (type == TYPE_SFIXED64) {
      UnknownFieldSet::AddFixed64(unknown_fields,number,value);
      return;
    }
    if (type != TYPE_INT64) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1ba4);
      pLVar1 = internal::LogMessage::operator<<(&local_48,"Invalid wire type for CPPTYPE_INT64: ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,type);
      internal::LogFinisher::operator=(&local_49,pLVar1);
      internal::LogMessage::~LogMessage(&local_48);
      return;
    }
  }
  UnknownFieldSet::AddVarint(unknown_fields,number,value);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetInt64(
    int number, int64 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_INT64:
      unknown_fields->AddVarint(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SFIXED64:
      unknown_fields->AddFixed64(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_SINT64:
      unknown_fields->AddVarint(
          number, internal::WireFormatLite::ZigZagEncode64(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_INT64: " << type;
      break;
  }
}